

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

void __thiscall
S2Loop::S2Loop(S2Loop *this,vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices,
              S2Debug override)

{
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Loop_002bc458;
  this->depth_ = 0;
  this->num_vertices_ = 0;
  this->vertices_ = (S2Point *)0x0;
  this->owns_vertices_ = false;
  this->s2debug_override_ = override;
  this->origin_inside_ = false;
  (this->bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002bc088;
  (this->bound_).lat_.bounds_.c_[0] = 1.0;
  (this->bound_).lat_.bounds_.c_[1] = 0.0;
  (this->bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  (this->subregion_bound_).super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2Region_002bc088;
  (this->subregion_bound_).lat_.bounds_.c_[0] = 1.0;
  (this->subregion_bound_).lat_.bounds_.c_[1] = 0.0;
  (this->subregion_bound_).lng_.bounds_.c_[0] = 3.141592653589793;
  (this->subregion_bound_).lng_.bounds_.c_[1] = -3.141592653589793;
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  Init(this,vertices);
  return;
}

Assistant:

S2Loop::S2Loop(const vector<S2Point>& vertices,
               S2Debug override)
  : s2debug_override_(override) {
  Init(vertices);
}